

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O2

int mbedtls_ecp_point_write_binary
              (mbedtls_ecp_group *grp,mbedtls_ecp_point *P,int format,size_t *olen,uchar *buf,
              size_t buflen)

{
  int iVar1;
  size_t buflen_00;
  uchar *buf_00;
  
  iVar1 = -0x4f80;
  if ((uint)format < 2) {
    buflen_00 = mbedtls_mpi_size(&grp->P);
    iVar1 = -0x4e80;
    if (((grp->G).X.p != (mbedtls_mpi_uint *)0x0) && ((grp->G).Y.p != (mbedtls_mpi_uint *)0x0)) {
      iVar1 = mbedtls_mpi_cmp_int(&P->Z,0);
      if (iVar1 == 0) {
        if (buflen == 0) {
          iVar1 = -0x4f00;
        }
        else {
          *buf = '\0';
          *olen = 1;
          iVar1 = 0;
        }
      }
      else if (format == 0) {
        *olen = buflen_00 * 2 + 1;
        iVar1 = -0x4f00;
        if (buflen_00 * 2 < buflen) {
          *buf = '\x04';
          iVar1 = mbedtls_mpi_write_binary(&P->X,buf + 1,buflen_00);
          if (iVar1 == 0) {
            P = (mbedtls_ecp_point *)&P->Y;
            buf_00 = buf + 1 + buflen_00;
            goto LAB_001a004a;
          }
        }
      }
      else {
        *olen = buflen_00 + 1;
        iVar1 = -0x4f00;
        if (buflen_00 + 1 <= buflen) {
          iVar1 = mbedtls_mpi_get_bit(&P->Y,0);
          *buf = (char)iVar1 + '\x02';
          buf_00 = buf + 1;
LAB_001a004a:
          iVar1 = mbedtls_mpi_write_binary(&P->X,buf_00,buflen_00);
          return iVar1;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_ecp_point_write_binary(const mbedtls_ecp_group *grp,
                                   const mbedtls_ecp_point *P,
                                   int format, size_t *olen,
                                   unsigned char *buf, size_t buflen)
{
    int ret = MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE;
    size_t plen;
    if (format != MBEDTLS_ECP_PF_UNCOMPRESSED &&
        format != MBEDTLS_ECP_PF_COMPRESSED) {
        return MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
    }

    plen = mbedtls_mpi_size(&grp->P);

#if defined(MBEDTLS_ECP_MONTGOMERY_ENABLED)
    (void) format; /* Montgomery curves always use the same point format */
    if (mbedtls_ecp_get_type(grp) == MBEDTLS_ECP_TYPE_MONTGOMERY) {
        *olen = plen;
        if (buflen < *olen) {
            return MBEDTLS_ERR_ECP_BUFFER_TOO_SMALL;
        }

        MBEDTLS_MPI_CHK(mbedtls_mpi_write_binary_le(&P->X, buf, plen));
    }
#endif
#if defined(MBEDTLS_ECP_SHORT_WEIERSTRASS_ENABLED)
    if (mbedtls_ecp_get_type(grp) == MBEDTLS_ECP_TYPE_SHORT_WEIERSTRASS) {
        /*
         * Common case: P == 0
         */
        if (mbedtls_mpi_cmp_int(&P->Z, 0) == 0) {
            if (buflen < 1) {
                return MBEDTLS_ERR_ECP_BUFFER_TOO_SMALL;
            }

            buf[0] = 0x00;
            *olen = 1;

            return 0;
        }

        if (format == MBEDTLS_ECP_PF_UNCOMPRESSED) {
            *olen = 2 * plen + 1;

            if (buflen < *olen) {
                return MBEDTLS_ERR_ECP_BUFFER_TOO_SMALL;
            }

            buf[0] = 0x04;
            MBEDTLS_MPI_CHK(mbedtls_mpi_write_binary(&P->X, buf + 1, plen));
            MBEDTLS_MPI_CHK(mbedtls_mpi_write_binary(&P->Y, buf + 1 + plen, plen));
        } else if (format == MBEDTLS_ECP_PF_COMPRESSED) {
            *olen = plen + 1;

            if (buflen < *olen) {
                return MBEDTLS_ERR_ECP_BUFFER_TOO_SMALL;
            }

            buf[0] = 0x02 + mbedtls_mpi_get_bit(&P->Y, 0);
            MBEDTLS_MPI_CHK(mbedtls_mpi_write_binary(&P->X, buf + 1, plen));
        }
    }
#endif

cleanup:
    return ret;
}